

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O0

void button_menu(void)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  char c;
  button *in_stack_ffffffffffffffd0;
  char local_1;
  
  local_1 = '\0';
  do {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"*** button menu ***");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(1) back");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(2) left");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(3) right");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(4) up");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(5) down");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(6) enter");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"(b)ack");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar3,"Choice: ");
    std::operator>>((istream *)&std::cin,&local_1);
    switch(local_1) {
    case '1':
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"back button is ");
      bVar2 = ev3dev::button::pressed(in_stack_ffffffffffffffd0);
      pcVar1 = "(4) up";
      if (bVar2) {
        pcVar1 = "(5) down";
      }
      poVar3 = std::operator<<(poVar3,pcVar1 + 4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case '2':
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"left button is ");
      bVar2 = ev3dev::button::pressed(in_stack_ffffffffffffffd0);
      pcVar1 = "(4) up";
      if (bVar2) {
        pcVar1 = "(5) down";
      }
      poVar3 = std::operator<<(poVar3,pcVar1 + 4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case '3':
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      in_stack_ffffffffffffffd0 = (button *)std::operator<<(poVar3,"right button is ");
      bVar2 = ev3dev::button::pressed(in_stack_ffffffffffffffd0);
      pcVar1 = "(4) up";
      if (bVar2) {
        pcVar1 = "(5) down";
      }
      poVar3 = std::operator<<((ostream *)in_stack_ffffffffffffffd0,pcVar1 + 4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case '4':
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"up button is ");
      bVar2 = ev3dev::button::pressed(in_stack_ffffffffffffffd0);
      pcVar1 = "(4) up";
      if (bVar2) {
        pcVar1 = "(5) down";
      }
      poVar3 = std::operator<<(poVar3,pcVar1 + 4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case '5':
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"down button is ");
      bVar2 = ev3dev::button::pressed(in_stack_ffffffffffffffd0);
      pcVar1 = "(4) up";
      if (bVar2) {
        pcVar1 = "(5) down";
      }
      poVar3 = std::operator<<(poVar3,pcVar1 + 4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case '6':
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"enter button is ");
      bVar2 = ev3dev::button::pressed(in_stack_ffffffffffffffd0);
      pcVar1 = "(4) up";
      if (bVar2) {
        pcVar1 = "(5) down";
      }
      poVar3 = std::operator<<(poVar3,pcVar1 + 4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  } while (local_1 != 'b');
  return;
}

Assistant:

void button_menu()
{
  char c = 0;
  do
  {
    cout << endl
         << "*** button menu ***" << endl
         << endl
         << "(1) back"  << endl
         << "(2) left"  << endl
         << "(3) right" << endl
         << "(4) up"    << endl
         << "(5) down"  << endl
         << "(6) enter" << endl
         << endl
         << "(b)ack"    << endl
         << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case '1':
      cout << endl << "back button is " << (button::back.pressed() ? "down" : "up") << endl;
      break;
    case '2':
      cout << endl << "left button is " << (button::left.pressed() ? "down" : "up") << endl;
      break;
    case '3':
      cout << endl << "right button is " << (button::right.pressed() ? "down" : "up") << endl;
      break;
    case '4':
      cout << endl << "up button is " << (button::up.pressed() ? "down" : "up") << endl;
      break;
    case '5':
      cout << endl << "down button is " << (button::down.pressed() ? "down" : "up") << endl;
      break;
    case '6':
      cout << endl << "enter button is " << (button::enter.pressed() ? "down" : "up") << endl;
      break;
    }
  }
  while (c != 'b');
}